

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O2

void nrg::PrioExecution::push<std::function<void()>>(Queue *queue,function<void_()> *fn)

{
  int iVar1;
  _Manager_type p_Var2;
  QueueElement elem;
  QueueElement QStack_68;
  QueueElement local_40;
  
  local_40.prio = 0;
  iVar1 = next()::nxt + 1;
  local_40.id = next()::nxt;
  local_40.what.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_40.what.super__Function_base._M_functor._8_8_ = 0;
  local_40.what.super__Function_base._M_manager = (_Manager_type)0x0;
  local_40.what._M_invoker = fn->_M_invoker;
  p_Var2 = (fn->super__Function_base)._M_manager;
  next()::nxt = iVar1;
  if (p_Var2 != (_Manager_type)0x0) {
    local_40.what.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(fn->super__Function_base)._M_functor;
    local_40.what.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(fn->super__Function_base)._M_functor + 8);
    (fn->super__Function_base)._M_manager = (_Manager_type)0x0;
    fn->_M_invoker = (_Invoker_type)0x0;
    local_40.what.super__Function_base._M_manager = p_Var2;
  }
  QueueElement::QueueElement(&QStack_68,&local_40);
  std::
  priority_queue<nrg::PrioExecution::QueueElement,_std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>,_std::greater<nrg::PrioExecution::QueueElement>_>
  ::push(queue,&QStack_68);
  std::_Function_base::~_Function_base(&QStack_68.what.super__Function_base);
  std::_Function_base::~_Function_base(&local_40.what.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { 0, next(), std::move(fn) };
        push(queue, std::move(elem));
    }